

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O3

int la_adsc_earth_air_ref_parse(void *dest,uint8_t *buf,uint32_t len)

{
  int iVar1;
  undefined8 in_RAX;
  ulong *puVar2;
  la_bitstream_t *bs;
  int iVar3;
  double dVar4;
  uint32_t tmp;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  iVar3 = -1;
  if (4 < len) {
    puVar2 = (ulong *)la_xcalloc(1,0x18,
                                 "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/adsc.c"
                                 ,0x27f,"la_adsc_earth_air_ref_parse");
    *(ulong **)((long)dest + 0x10) = puVar2;
    bs = la_bitstream_init(0x28);
    iVar1 = la_bitstream_append_msbfirst(bs,buf,5,8);
    if (-1 < iVar1) {
      iVar1 = la_bitstream_read_word_msbfirst(bs,&local_24,1);
      iVar3 = -1;
      if (-1 < iVar1) {
        *(undefined1 *)((long)puVar2 + 0x14) = (undefined1)local_24;
        iVar1 = la_bitstream_read_word_msbfirst(bs,&local_24,0xc);
        if (-1 < iVar1) {
          dVar4 = ((double)((int)(local_24 << 0x14) >> 0x14) * 179.912109375) / 2047.0;
          *puVar2 = ~-(ulong)(dVar4 < 0.0) & (ulong)dVar4 |
                    (ulong)(dVar4 + 360.0) & -(ulong)(dVar4 < 0.0);
          iVar1 = la_bitstream_read_word_msbfirst(bs,&local_24,0xd);
          if (-1 < iVar1) {
            puVar2[1] = (ulong)((double)local_24 * 0.5);
            iVar1 = la_bitstream_read_word_msbfirst(bs,&local_24,0xc);
            if (-1 < iVar1) {
              *(int *)(puVar2 + 2) = (int)(local_24 << 0x14) >> 0x10;
              la_bitstream_destroy(bs);
              iVar3 = 5;
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

LA_ADSC_PARSER_FUN(la_adsc_earth_air_ref_parse) {
	uint32_t tag_len = 5;
	la_adsc_tag_t *t = dest;
	LA_ADSC_CHECK_LEN(t->tag, len, tag_len);
	LA_NEW(la_adsc_earth_air_ref_t, r);
	t->data = r;

	la_bitstream_t *bs = la_bitstream_init(tag_len * 8);
	if(la_bitstream_append_msbfirst(bs, buf, tag_len, 8) < 0) {
		return -1;
	}

	uint32_t tmp;
	LA_BS_READ_OR_RETURN(bs, &tmp, 1, -1);
	r->heading_invalid = tmp;
	LA_BS_READ_OR_RETURN(bs, &tmp, 12, -1);
	r->heading = la_adsc_heading_parse(tmp);
	LA_BS_READ_OR_RETURN(bs, &tmp, 13, -1);
	r->speed = la_adsc_speed_parse(tmp);
	LA_BS_READ_OR_RETURN(bs, &tmp, 12, -1);
	r->vert_speed = la_adsc_vert_speed_parse(tmp);

	la_bitstream_destroy(bs);
	return tag_len;
}